

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O0

void GenerateReverseLUT_16(UINT32 dstLen,UINT16 *dstLUT,UINT32 srcLen,UINT16 *srcLUT)

{
  uint local_40;
  uint local_3c;
  FUINT16 local_38;
  FUINT16 minDist;
  UINT32 minIdx;
  FUINT16 dist;
  UINT32 curDst;
  UINT32 curSrc;
  UINT16 *srcLUT_local;
  UINT32 srcLen_local;
  UINT16 *dstLUT_local;
  UINT32 dstLen_local;
  
  memset(dstLUT,0,(ulong)(dstLen << 1));
  for (dist = 0; dist < srcLen; dist = dist + 1) {
    if (srcLUT[dist] < dstLen) {
      dstLUT[srcLUT[dist]] = (UINT16)dist;
    }
  }
  for (minIdx = 0; minIdx < dstLen; minIdx = minIdx + 1) {
    if ((dstLUT[minIdx] == 0) && (*srcLUT != minIdx)) {
      local_3c = 0xffff;
      local_38 = 0;
      for (dist = 0; dist < srcLen; dist = dist + 1) {
        if (srcLUT[dist] < minIdx) {
          local_40 = minIdx - srcLUT[dist];
        }
        else {
          local_40 = srcLUT[dist] - minIdx;
        }
        if ((local_40 < local_3c) || ((local_3c == local_40 && (minIdx < srcLUT[dist])))) {
          local_3c = local_40;
          local_38 = dist;
        }
      }
      dstLUT[minIdx] = (UINT16)local_38;
    }
  }
  return;
}

Assistant:

void GenerateReverseLUT_16(UINT32 dstLen, UINT16* dstLUT, UINT32 srcLen, const UINT16* srcLUT)
{
	UINT32 curSrc;
	UINT32 curDst;
	FUINT16 dist;
	UINT32 minIdx;
	FUINT16 minDist;
	
	memset(dstLUT, 0x00, dstLen * 0x02);
	for (curSrc = 0x00; curSrc < srcLen; curSrc ++)
	{
		if (srcLUT[curSrc] < dstLen)
			dstLUT[srcLUT[curSrc]] = (UINT16)curSrc;
	}
	
	for (curDst = 0x00; curDst < dstLen; curDst ++)
	{
		if (! dstLUT[curDst] && srcLUT[0] != curDst)
		{
			minDist = 0xFFFF;
			minIdx = 0x00;
			for (curSrc = 0x00; curSrc < srcLen; curSrc ++)
			{
				dist = (curDst > srcLUT[curSrc]) ? (curDst - srcLUT[curSrc]) : (srcLUT[curSrc] - curDst);
				// The second condition results in more algorithm-like rounding.
				if (minDist > dist || (minDist == dist && (curDst < srcLUT[curSrc])))
				{
					minDist = dist;
					minIdx = curSrc;
				}
			}
			dstLUT[curDst] = (UINT16)minIdx;
		}
	}
	
	return;
}